

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceBase.hpp
# Opt level: O3

void __thiscall
Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>::CreateDeferredContextImpl<>
          (RenderDeviceBase<Diligent::EngineVkImplTraits> *this,IDeviceContext **ppContext)

{
  size_type *psVar1;
  pointer pvVar2;
  long lVar3;
  bool bVar4;
  anon_class_24_3_c3e95c83 ConstructObject;
  char cVar5;
  char cVar6;
  int iVar7;
  undefined8 *puVar8;
  long *plVar9;
  pointer pvVar10;
  long *plVar11;
  char (*Args_1) [40];
  uint uVar12;
  ulong uVar13;
  DeviceContextVkImpl *pObj;
  ulong uVar14;
  uint __val;
  uint uVar16;
  string msg;
  DeviceContextDesc Desc;
  string __str;
  string __str_1;
  string CtxName;
  string local_138;
  DeviceContextDesc local_118;
  long lStack_100;
  IDeviceContext **local_f8;
  ulong *local_f0;
  uint local_e8;
  undefined4 uStack_e4;
  ulong local_e0 [2];
  long *local_d0;
  undefined8 local_c8;
  long local_c0;
  undefined8 uStack_b8;
  pthread_mutex_t *local_b0;
  ulong *local_a8;
  uint local_a0;
  undefined4 uStack_9c;
  ulong local_98 [2];
  ulong *local_88;
  long local_80;
  ulong local_78 [2];
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  RenderDeviceBase<Diligent::EngineVkImplTraits> *local_48;
  DeviceContextDesc *pDStack_40;
  IDeviceContext ***local_38;
  char (*pacVar15) [40];
  
  local_f8 = ppContext;
  iVar7 = pthread_mutex_lock((pthread_mutex_t *)&this->m_DeferredCtxMtx);
  if (iVar7 != 0) {
    std::__throw_system_error(iVar7);
  }
  pvVar10 = (this->m_wpDeferredContexts).
            super__Vector_base<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::IMemoryAllocator>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_wpDeferredContexts).
      super__Vector_base<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::IMemoryAllocator>_>
      ._M_impl.super__Vector_impl_data._M_finish == pvVar10) {
    __val = 0;
    pacVar15 = (char (*) [40])0x0;
  }
  else {
    pacVar15 = (char (*) [40])0x0;
    do {
      __val = (uint)pacVar15;
      if (((pvVar10[(long)pacVar15].m_pObject == (DeviceContextVkImpl *)0x0) ||
          (pvVar10[(long)pacVar15].m_pRefCounters == (RefCountersImpl *)0x0)) ||
         (((pvVar10[(long)pacVar15].m_pRefCounters)->m_NumStrongReferences).super___atomic_base<int>
          ._M_i < 1)) break;
      __val = __val + 1;
      pacVar15 = (char (*) [40])(ulong)__val;
      pvVar10 = (this->m_wpDeferredContexts).
                super__Vector_base<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::IMemoryAllocator>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (pacVar15 <
             (char (*) [40])
             ((long)(this->m_wpDeferredContexts).
                    super__Vector_base<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::IMemoryAllocator>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar10 >> 4));
  }
  pvVar10 = (this->m_wpImmediateContexts).
            super__Vector_base<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::IMemoryAllocator>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pvVar2 = (this->m_wpImmediateContexts).
           super__Vector_base<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::IMemoryAllocator>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_b0 = (pthread_mutex_t *)&this->m_DeferredCtxMtx;
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"Deferred context ","");
  cVar6 = '\x01';
  if (9 < __val) {
    uVar13 = (ulong)__val;
    cVar5 = '\x04';
    do {
      cVar6 = cVar5;
      uVar16 = (uint)uVar13;
      if (uVar16 < 100) {
        cVar6 = cVar6 + -2;
        goto LAB_00212b9a;
      }
      if (uVar16 < 1000) {
        cVar6 = cVar6 + -1;
        goto LAB_00212b9a;
      }
      if (uVar16 < 10000) goto LAB_00212b9a;
      uVar13 = uVar13 / 10000;
      cVar5 = cVar6 + '\x04';
    } while (99999 < uVar16);
    cVar6 = cVar6 + '\x01';
  }
LAB_00212b9a:
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct((ulong)&local_f0,cVar6);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_f0,local_e8,__val);
  uVar13 = CONCAT44(uStack_e4,local_e8) + local_80;
  uVar14 = 0xf;
  if (local_88 != local_78) {
    uVar14 = local_78[0];
  }
  if (uVar14 < uVar13) {
    uVar14 = 0xf;
    if (local_f0 != local_e0) {
      uVar14 = local_e0[0];
    }
    if (uVar14 < uVar13) goto LAB_00212c10;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_88);
  }
  else {
LAB_00212c10:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_f0);
  }
  local_d0 = &local_c0;
  plVar9 = puVar8 + 2;
  if ((long *)*puVar8 == plVar9) {
    local_c0 = *plVar9;
    uStack_b8 = puVar8[3];
  }
  else {
    local_c0 = *plVar9;
    local_d0 = (long *)*puVar8;
  }
  local_c8 = puVar8[1];
  *puVar8 = plVar9;
  puVar8[1] = 0;
  *(undefined1 *)plVar9 = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_d0);
  uVar16 = (int)((ulong)((long)pvVar10 - (long)pvVar2) >> 4) + __val;
  local_118.Name = (Char *)(local_118.TextureCopyGranularity + 1);
  plVar11 = plVar9 + 2;
  if ((Uint32 *)*plVar9 == (Uint32 *)plVar11) {
    lStack_100 = plVar9[3];
    local_118.TextureCopyGranularity[1] = (Uint32)*plVar11;
    local_118.TextureCopyGranularity[2] = (Uint32)((ulong)*plVar11 >> 0x20);
  }
  else {
    local_118.TextureCopyGranularity[1] = (Uint32)*plVar11;
    local_118.TextureCopyGranularity[2] = (Uint32)((ulong)*plVar11 >> 0x20);
    local_118.Name = (Char *)*plVar9;
  }
  lVar3 = plVar9[1];
  local_118._8_2_ = SUB82(lVar3,0);
  local_118.ContextId = (Uint8)((ulong)lVar3 >> 0x10);
  local_118.QueueId = (Uint8)((ulong)lVar3 >> 0x18);
  local_118.TextureCopyGranularity[0] = (Uint32)((ulong)lVar3 >> 0x20);
  *plVar9 = (long)plVar11;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  cVar6 = '\x01';
  if (9 < uVar16) {
    uVar12 = uVar16;
    cVar5 = '\x04';
    do {
      cVar6 = cVar5;
      if (uVar12 < 100) {
        cVar6 = cVar6 + -2;
        goto LAB_00212d30;
      }
      if (uVar12 < 1000) {
        cVar6 = cVar6 + -1;
        goto LAB_00212d30;
      }
      if (uVar12 < 10000) goto LAB_00212d30;
      bVar4 = 99999 < uVar12;
      uVar12 = uVar12 / 10000;
      cVar5 = cVar6 + '\x04';
    } while (bVar4);
    cVar6 = cVar6 + '\x01';
  }
LAB_00212d30:
  local_a8 = local_98;
  std::__cxx11::string::_M_construct((ulong)&local_a8,cVar6);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_a8,local_a0,uVar16);
  uVar13 = CONCAT44(uStack_9c,local_a0) +
           CONCAT44(local_118.TextureCopyGranularity[0],
                    CONCAT13(local_118.QueueId,CONCAT12(local_118.ContextId,local_118._8_2_)));
  uVar14 = 0xf;
  if ((Uint32 *)local_118.Name != local_118.TextureCopyGranularity + 1) {
    uVar14 = CONCAT44(local_118.TextureCopyGranularity[2],local_118.TextureCopyGranularity[1]);
  }
  if (uVar14 < uVar13) {
    uVar14 = 0xf;
    if (local_a8 != local_98) {
      uVar14 = local_98[0];
    }
    if (uVar13 <= uVar14) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,(ulong)local_118.Name);
      goto LAB_00212dcf;
    }
  }
  puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_a8);
LAB_00212dcf:
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  psVar1 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_138.field_2._M_allocated_capacity = *psVar1;
    local_138.field_2._8_8_ = puVar8[3];
  }
  else {
    local_138.field_2._M_allocated_capacity = *psVar1;
    local_138._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_138._M_string_length = puVar8[1];
  *puVar8 = psVar1;
  puVar8[1] = 0;
  *(undefined1 *)psVar1 = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_138);
  local_68 = &local_58;
  plVar11 = plVar9 + 2;
  if ((long *)*plVar9 == plVar11) {
    local_58 = *plVar11;
    lStack_50 = plVar9[3];
  }
  else {
    local_58 = *plVar11;
    local_68 = (long *)*plVar9;
  }
  local_60 = plVar9[1];
  *plVar9 = (long)plVar11;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  if ((Uint32 *)local_118.Name != local_118.TextureCopyGranularity + 1) {
    operator_delete(local_118.Name,
                    CONCAT44(local_118.TextureCopyGranularity[2],local_118.TextureCopyGranularity[1]
                            ) + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0,local_e0[0] + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  pDStack_40 = &local_118;
  local_118.Name = (Char *)local_68;
  local_118.QueueType = COMMAND_QUEUE_TYPE_UNKNOWN;
  local_118.IsDeferred = true;
  local_118.ContextId = (Uint8)uVar16;
  local_118.QueueId = 0xff;
  local_118.TextureCopyGranularity[0] = 0;
  local_118.TextureCopyGranularity[1] = 0;
  local_118.TextureCopyGranularity[2] = 0;
  local_38 = &local_f8;
  ConstructObject.Desc = pDStack_40;
  ConstructObject.this = this;
  ConstructObject.ppContext = local_38;
  local_48 = this;
  CreateDeviceObject<Diligent::IDeviceContext,Diligent::DeviceContextDesc,Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>::CreateDeferredContextImpl<>(Diligent::IDeviceContext**)::_lambda()_1_>
            (this,"Device context",pDStack_40,local_f8,ConstructObject);
  pObj = (DeviceContextVkImpl *)*local_f8;
  if (pObj != (DeviceContextVkImpl *)0x0) {
    pvVar10 = (this->m_wpDeferredContexts).
              super__Vector_base<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::IMemoryAllocator>_>
              ._M_impl.super__Vector_impl_data._M_start;
    Args_1 = (char (*) [40])
             ((long)(this->m_wpDeferredContexts).
                    super__Vector_base<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::IMemoryAllocator>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar10 >> 4);
    if (Args_1 <= pacVar15) {
      if (Args_1 != pacVar15) {
        FormatString<char[26],char[40]>
                  (&local_138,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"CtxIndex == m_wpDeferredContexts.size()",Args_1);
        DebugAssertionFailed
                  (local_138._M_dataplus._M_p,"CreateDeferredContextImpl",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
                   ,0x2a1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
      }
      std::
      vector<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::IMemoryAllocator>_>
      ::resize(&this->m_wpDeferredContexts,(ulong)(__val + 1));
      pObj = (DeviceContextVkImpl *)*local_f8;
      pvVar10 = (this->m_wpDeferredContexts).
                super__Vector_base<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::IMemoryAllocator>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    RefCntWeakPtr<Diligent::DeviceContextVkImpl>::operator=(pvVar10 + (long)pacVar15,pObj);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68,local_58 + 1);
  }
  pthread_mutex_unlock(local_b0);
  return;
}

Assistant:

void CreateDeferredContextImpl(IDeviceContext** ppContext, const ExtraArgsType&... ExtraArgs)
    {
        std::lock_guard<std::mutex> Guard{m_DeferredCtxMtx};

        Uint32 CtxIndex = 0;
        while (CtxIndex < m_wpDeferredContexts.size() && m_wpDeferredContexts[CtxIndex].IsValid())
            ++CtxIndex;

        const Uint32      ContextId = static_cast<Uint32>(GetNumImmediateContexts()) + CtxIndex;
        const std::string CtxName   = std::string{"Deferred context "} + std::to_string(CtxIndex) + " (ContextId: " + std::to_string(ContextId) + ")";
        DeviceContextDesc Desc{
            CtxName.c_str(),
            COMMAND_QUEUE_TYPE_UNKNOWN,
            true, // IsDeferred
            ContextId,
        };

        CreateDeviceObject("Device context", Desc, ppContext,
                           [&]() //
                           {
                               DeviceContextImplType* pCtxImpl = NEW_RC_OBJ(GetRawAllocator(), "DeviceContext instance", DeviceContextImplType)(
                                   static_cast<RenderDeviceImplType*>(this),
                                   Desc,
                                   ExtraArgs...);
                               pCtxImpl->QueryInterface(IID_DeviceContext, reinterpret_cast<IObject**>(ppContext));
                           });

        if (*ppContext != nullptr)
        {
            if (CtxIndex >= m_wpDeferredContexts.size())
            {
                VERIFY_EXPR(CtxIndex == m_wpDeferredContexts.size());
                m_wpDeferredContexts.resize(CtxIndex + 1);
            }

            m_wpDeferredContexts[CtxIndex] = static_cast<DeviceContextImplType*>(*ppContext);
        }
    }